

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* lest::split_arguments
            (pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,texts *args)

{
  pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *ppVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  runtime_error *this;
  text *this_00;
  pointer pbVar7;
  options option;
  undefined1 local_1c8 [32];
  _Alloc_hider _Stack_1a8;
  pointer local_1a0;
  text val;
  text local_168;
  text local_148;
  pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_128;
  texts *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  text opt;
  texts in;
  runtime_error local_c0 [16];
  text local_b0;
  text local_90;
  text local_70;
  text arg;
  
  option.help = false;
  option.abort = false;
  option.count = false;
  option.list = false;
  option.tags = false;
  option.time = false;
  option.pass = false;
  option.zen = false;
  option.lexical = false;
  option.random = false;
  option.verbose = false;
  option.version = false;
  option.repeat = 1;
  option.seed = 0;
  in.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  in.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar7 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar2 = true;
  bVar4 = false;
  bVar3 = false;
  local_128 = __return_storage_ptr__;
  local_120 = args;
  do {
    if (pbVar7 == (local_120->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      bVar2 = true;
      if (!bVar3) {
        bVar2 = bVar4;
      }
      option.pass = bVar2;
      std::
      make_pair<lest::options&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                ((pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_1c8,&option,&in);
      ppVar1 = local_128;
      (local_128->first).seed = CONCAT71(local_1c8._17_7_,local_1c8[0x10]);
      (local_128->first).help = (bool)local_1c8[0];
      (local_128->first).abort = (bool)local_1c8[1];
      (local_128->first).count = (bool)local_1c8[2];
      (local_128->first).list = (bool)local_1c8[3];
      (local_128->first).tags = (bool)local_1c8[4];
      (local_128->first).time = (bool)local_1c8[5];
      (local_128->first).pass = (bool)local_1c8[6];
      (local_128->first).zen = (bool)local_1c8[7];
      (local_128->first).lexical = (bool)local_1c8[8];
      (local_128->first).random = (bool)local_1c8[9];
      (local_128->first).verbose = (bool)local_1c8[10];
      (local_128->first).version = (bool)local_1c8[0xb];
      (local_128->first).repeat = local_1c8._12_4_;
      (local_128->second).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1c8._24_8_;
      (local_128->second).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Stack_1a8._M_p;
      (local_128->second).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_1a0;
      local_1c8._24_8_ = 0;
      _Stack_1a8._M_p = (pointer)0x0;
      local_1a0 = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1c8 + 0x18));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&in);
      return ppVar1;
    }
    opt._M_dataplus._M_p = (pointer)&opt.field_2;
    opt._M_string_length = 0;
    opt.field_2._M_local_buf[0] = '\0';
    val._M_dataplus._M_p = (pointer)&val.field_2;
    val._M_string_length = 0;
    val.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)&arg,(string *)pbVar7);
    std::__cxx11::string::string((string *)&local_70,(string *)&arg);
    split_option((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1c8,&local_70);
    local_118._M_dataplus._M_p = (pointer)&val;
    local_118._M_string_length = (size_type)&opt;
    std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
              ((tuple<std::__cxx11::string&,std::__cxx11::string&> *)&local_118,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1c8);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_1c8);
    std::__cxx11::string::~string((string *)&local_70);
    if ((bVar2) && (*opt._M_dataplus._M_p == '-')) {
      bVar2 = std::operator==(&opt,"--");
      if (bVar2) goto LAB_00193f9b;
      bVar2 = std::operator==(&opt,"-h");
      if (bVar2) {
LAB_00193f82:
        option.help = true;
LAB_00193f86:
        bVar2 = true;
      }
      else {
        bVar2 = std::operator==("--help",&opt);
        if (bVar2) goto LAB_00193f82;
        bVar2 = std::operator==(&opt,"-a");
        if (bVar2) {
LAB_00193fe7:
          option.abort = true;
          goto LAB_00193f86;
        }
        bVar2 = std::operator==("--abort",&opt);
        if (bVar2) goto LAB_00193fe7;
        bVar2 = std::operator==(&opt,"-c");
        if (bVar2) {
LAB_00194014:
          option.count = true;
          goto LAB_00193f86;
        }
        bVar2 = std::operator==("--count",&opt);
        if (bVar2) goto LAB_00194014;
        bVar2 = std::operator==(&opt,"-g");
        if (bVar2) {
LAB_00194044:
          option.tags = true;
          goto LAB_00193f86;
        }
        bVar2 = std::operator==("--list-tags",&opt);
        if (bVar2) goto LAB_00194044;
        bVar2 = std::operator==(&opt,"-l");
        if (bVar2) {
LAB_00194074:
          option.list = true;
          goto LAB_00193f86;
        }
        bVar2 = std::operator==("--list-tests",&opt);
        if (bVar2) goto LAB_00194074;
        bVar2 = std::operator==(&opt,"-t");
        if (bVar2) {
LAB_001940a4:
          option.time = true;
          goto LAB_00193f86;
        }
        bVar2 = std::operator==("--time",&opt);
        if (bVar2) goto LAB_001940a4;
        bVar2 = std::operator==(&opt,"-p");
        if (bVar2) {
LAB_001940d4:
          option.pass = true;
          bVar3 = true;
          goto LAB_00193f86;
        }
        bVar2 = std::operator==("--pass",&opt);
        if (bVar2) goto LAB_001940d4;
        bVar2 = std::operator==(&opt,"-z");
        if (bVar2) {
LAB_0019410a:
          option.zen = true;
          bVar4 = true;
          goto LAB_00193f86;
        }
        bVar2 = std::operator==("--pass-zen",&opt);
        if (bVar2) goto LAB_0019410a;
        bVar2 = std::operator==(&opt,"-v");
        if (bVar2) {
LAB_00194140:
          option.verbose = true;
          goto LAB_00193f86;
        }
        bVar2 = std::operator==("--verbose",&opt);
        if (bVar2) goto LAB_00194140;
        bVar2 = std::operator==("--version",&opt);
        if (bVar2) {
          option.version = true;
          goto LAB_00193f86;
        }
        bVar2 = std::operator==(&opt,"--order");
        if (!bVar2) {
LAB_00194196:
          bVar2 = std::operator==(&opt,"--order");
          if (bVar2) {
            bVar2 = std::operator==("lexical",&val);
            if (bVar2) {
              option.lexical = true;
              goto LAB_00193f86;
            }
          }
          bVar2 = std::operator==(&opt,"--order");
          if (bVar2) {
            bVar2 = std::operator==("random",&val);
            if (bVar2) {
              option.random = true;
              goto LAB_00193f86;
            }
          }
          bVar2 = std::operator==(&opt,"--random-seed");
          if (bVar2) {
            std::__cxx11::string::string
                      ((string *)local_1c8,"--random-seed",(allocator *)&local_118);
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            if ((undefined1 *)local_1c8._0_8_ == local_1c8 + 0x10) {
              local_148.field_2._8_8_ = local_1c8._24_8_;
            }
            else {
              local_148._M_dataplus._M_p = (pointer)local_1c8._0_8_;
            }
            local_148.field_2._M_allocated_capacity._1_7_ = local_1c8._17_7_;
            local_148.field_2._M_local_buf[0] = local_1c8[0x10];
            local_148._M_string_length = local_1c8._8_8_;
            local_1c8._0_8_ = local_1c8 + 0x10;
            local_1c8._8_8_ = 0;
            local_1c8[0x10] = '\0';
            std::__cxx11::string::string((string *)&local_90,(string *)&val);
            option.seed = seed(&local_148,&local_90);
            std::__cxx11::string::~string((string *)&local_90);
            this_00 = &local_148;
          }
          else {
            bVar2 = std::operator==(&opt,"--repeat");
            if (!bVar2) {
              this = (runtime_error *)__cxa_allocate_exception(0x10);
              std::operator+(&local_118,"unrecognised option \'",&opt);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1c8,&local_118,"\' (try option --help)");
              std::runtime_error::runtime_error(local_c0,(string *)local_1c8);
              std::runtime_error::runtime_error(this,local_c0);
              __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            std::__cxx11::string::string((string *)local_1c8,"--repeat",(allocator *)&local_118);
            local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
            if ((undefined1 *)local_1c8._0_8_ == local_1c8 + 0x10) {
              local_168.field_2._8_8_ = local_1c8._24_8_;
            }
            else {
              local_168._M_dataplus._M_p = (pointer)local_1c8._0_8_;
            }
            local_168.field_2._M_allocated_capacity._1_7_ = local_1c8._17_7_;
            local_168.field_2._M_local_buf[0] = local_1c8[0x10];
            local_168._M_string_length = local_1c8._8_8_;
            local_1c8._0_8_ = local_1c8 + 0x10;
            local_1c8._8_8_ = 0;
            local_1c8[0x10] = '\0';
            std::__cxx11::string::string((string *)&local_b0,(string *)&val);
            iVar6 = repeat(&local_168,&local_b0);
            option.repeat = iVar6;
            std::__cxx11::string::~string((string *)&local_b0);
            this_00 = &local_168;
          }
          std::__cxx11::string::~string((string *)this_00);
          std::__cxx11::string::~string((string *)local_1c8);
          goto LAB_00193f86;
        }
        bVar5 = std::operator==("declared",&val);
        bVar2 = true;
        if (!bVar5) goto LAB_00194196;
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&in,&arg);
LAB_00193f9b:
      bVar2 = false;
    }
    std::__cxx11::string::~string((string *)&arg);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)&opt);
    pbVar7 = pbVar7 + 1;
  } while( true );
}

Assistant:

inline std::pair<options, texts>
split_arguments( texts args )
{
    options option; texts in;

    bool in_options = true;

    for ( texts::iterator pos = args.begin(); pos != args.end() ; ++pos )
    {
        text opt, val, arg = *pos;
        tie( opt, val ) = split_option( arg );

        if ( in_options )
        {
            if      ( opt[0] != '-'                             ) { in_options     = false;           }
            else if ( opt == "--"                               ) { in_options     = false; continue; }
            else if ( opt == "-h"      || "--help"       == opt ) { option.help    =  true; continue; }
            else if ( opt == "-a"      || "--abort"      == opt ) { option.abort   =  true; continue; }
            else if ( opt == "-c"      || "--count"      == opt ) { option.count   =  true; continue; }
            else if ( opt == "-g"      || "--list-tags"  == opt ) { option.tags    =  true; continue; }
            else if ( opt == "-l"      || "--list-tests" == opt ) { option.list    =  true; continue; }
            else if ( opt == "-t"      || "--time"       == opt ) { option.time    =  true; continue; }
            else if ( opt == "-p"      || "--pass"       == opt ) { option.pass    =  true; continue; }
            else if ( opt == "-z"      || "--pass-zen"   == opt ) { option.zen     =  true; continue; }
            else if ( opt == "-v"      || "--verbose"    == opt ) { option.verbose =  true; continue; }
            else if (                     "--version"    == opt ) { option.version =  true; continue; }
            else if ( opt == "--order" && "declared"     == val ) { /* by definition */   ; continue; }
            else if ( opt == "--order" && "lexical"      == val ) { option.lexical =  true; continue; }
            else if ( opt == "--order" && "random"       == val ) { option.random  =  true; continue; }
            else if ( opt == "--random-seed" ) { option.seed   = seed  ( "--random-seed", val ); continue; }
            else if ( opt == "--repeat"      ) { option.repeat = repeat( "--repeat"     , val ); continue; }
            else throw std::runtime_error( "unrecognised option '" + opt + "' (try option --help)" );
        }
        in.push_back( arg );
    }
    option.pass = option.pass || option.zen;

    return std::make_pair( option, in );
}